

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceLibrary * __thiscall slang::SourceManager::getLibraryFor(SourceManager *this,BufferID buffer)

{
  FileInfo *pFVar1;
  shared_lock<std::shared_mutex> *in_RDI;
  FileInfo *info;
  shared_lock<std::shared_mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  shared_lock<std::shared_mutex> *psVar2;
  SourceManager *in_stack_ffffffffffffffb0;
  BufferID in_stack_ffffffffffffffbc;
  shared_lock<std::shared_mutex> local_28 [2];
  SourceLibrary *local_8;
  
  psVar2 = local_28;
  std::shared_lock<std::shared_mutex>::shared_lock(in_RDI,in_stack_ffffffffffffff98);
  pFVar1 = getFileInfo<std::shared_lock<std::shared_mutex>_>
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffbc,psVar2);
  if (pFVar1 == (FileInfo *)0x0) {
    local_8 = (SourceLibrary *)0x0;
  }
  else {
    local_8 = pFVar1->library;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(in_RDI);
  return local_8;
}

Assistant:

const SourceLibrary* SourceManager::getLibraryFor(BufferID buffer) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(buffer, lock);
    if (!info)
        return nullptr;

    return info->library;
}